

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.cpp
# Opt level: O2

void spvPushOperandTypes(spv_operand_type_t *types,spv_operand_pattern_t *pattern)

{
  int *piVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    piVar1 = (int *)((long)types + lVar2);
    lVar2 = lVar2 + 4;
  } while (*piVar1 != 0);
  for (; lVar2 != 4; lVar2 = lVar2 + -4) {
    std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>::push_back
              (pattern,(value_type *)((long)types + lVar2 + -8));
  }
  return;
}

Assistant:

void spvPushOperandTypes(const spv_operand_type_t* types,
                         spv_operand_pattern_t* pattern) {
  const spv_operand_type_t* endTypes;
  for (endTypes = types; *endTypes != SPV_OPERAND_TYPE_NONE; ++endTypes) {
  }

  while (endTypes-- != types) {
    pattern->push_back(*endTypes);
  }
}